

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
mvm::test::test_instr_set::randn
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          test_instr_set *this,ui32 n)

{
  allocator_type local_19;
  value_type_conflict3 local_18;
  uint local_14;
  
  local_14 = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->call_stack,&local_14);
  local_18 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)n,&local_18,&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ui32> randn(ui32 n) {
    call_stack.push_back(4);
    return std::vector<ui32>(n, 1);
  }